

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::process_empty_brackets
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  bool bVar1;
  int iVar2;
  signal_types sVar3;
  undefined8 uVar4;
  reference pvVar5;
  void *pvVar6;
  compile_error *this_00;
  deque<int,_std::allocator<int>_> *in_RSI;
  token_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  anon_class_16_2_da9a1ae8 insert_bracket;
  bool empty_bracket;
  deque<int,_std::allocator<int>_> blist_stack;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  _Self *in_stack_fffffffffffffca8;
  compile_error *in_stack_fffffffffffffcb0;
  deque<int,_std::allocator<int>_> *in_stack_fffffffffffffcc0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffcd0;
  void *in_stack_fffffffffffffcf8;
  token_signal *in_stack_fffffffffffffd00;
  anon_class_16_2_da9a1ae8 *in_stack_fffffffffffffd10;
  allocator local_289;
  string local_288 [32];
  void *local_268;
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [32];
  void *local_210;
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [32];
  void *local_1b8;
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [36];
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  reference local_150;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_128;
  undefined1 *local_108;
  undefined1 *local_100;
  deque<int,_std::allocator<int>_> *local_f8;
  byte local_e9;
  undefined1 local_e8 [80];
  undefined1 local_98 [83];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  deque<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x21ccb4);
  if (bVar1) {
    local_45 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Received empty token buffer.",&local_31);
    compile_error::compile_error(in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
    local_45 = 0;
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x21cdbe);
  std::swap<cs::token_base*,std::allocator<cs::token_base*>>
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffcb0
             ,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              in_stack_fffffffffffffca8);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(in_stack_fffffffffffffcd0);
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x21cded);
  local_e9 = 0;
  local_100 = local_e8;
  local_f8 = local_10;
  local_108 = local_98;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffca8
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffca8
            );
  do {
    bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    if (!bVar1) {
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x21d801);
      if (bVar1) {
        std::deque<int,_std::allocator<int>_>::~deque
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffd00);
        return;
      }
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"Parentheses do not match.",&local_289);
      compile_error::compile_error(this_00,(string *)in_stack_fffffffffffffca8);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_150 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                operator*(&local_128);
    iVar2 = (*(*local_150)->_vptr_token_base[2])();
    if (iVar2 == 3) {
      sVar3 = token_signal::get_signal((token_signal *)*local_150);
      switch(sVar3) {
      case slb_:
        if ((local_e9 & 1) != 0) {
          process_empty_brackets::anon_class_16_2_da9a1ae8::operator()(in_stack_fffffffffffffd10);
        }
        local_154 = 1;
        std::deque<int,_std::allocator<int>_>::push_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                   (value_type_conflict5 *)in_stack_fffffffffffffca8);
        local_e9 = 1;
        break;
      case srb_:
        bVar1 = std::deque<int,_std::allocator<int>_>::empty
                          ((deque<int,_std::allocator<int>_> *)0x21cffa);
        if (bVar1) {
          local_182 = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_180,"Parentheses do not match.",&local_181);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_182 = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        pvVar5 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffcc0);
        if (*pvVar5 != 1) {
          local_1aa = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1a8,"The parentheses type does not match.(Request Small Bracket)",
                     &local_1a9);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_1aa = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0);
        if ((local_e9 & 1) == 0) goto switchD_0021ced6_default;
        local_e9 = 0;
        pvVar6 = token_base::operator_new((size_t)in_stack_fffffffffffffcb0);
        token_signal::token_signal
                  (in_stack_fffffffffffffd00,
                   (signal_types)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        local_1b8 = pvVar6;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
        break;
      case mlb_:
        if ((local_e9 & 1) != 0) {
          process_empty_brackets::anon_class_16_2_da9a1ae8::operator()(in_stack_fffffffffffffd10);
        }
        local_158 = 2;
        std::deque<int,_std::allocator<int>_>::push_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                   (value_type_conflict5 *)in_stack_fffffffffffffca8);
        local_e9 = 1;
        break;
      case mrb_:
        bVar1 = std::deque<int,_std::allocator<int>_>::empty
                          ((deque<int,_std::allocator<int>_> *)0x21d2aa);
        if (bVar1) {
          local_1da = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d8,"Parentheses do not match.",&local_1d9);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_1da = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        pvVar5 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffcc0);
        if (*pvVar5 != 2) {
          local_202 = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_200,"The parentheses type does not match.(Request Middle Bracket)",
                     &local_201);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_202 = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0);
        if ((local_e9 & 1) == 0) goto switchD_0021ced6_default;
        local_e9 = 0;
        in_stack_fffffffffffffcf8 = token_base::operator_new((size_t)in_stack_fffffffffffffcb0);
        token_signal::token_signal
                  (in_stack_fffffffffffffd00,
                   (signal_types)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        local_210 = in_stack_fffffffffffffcf8;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
        break;
      case llb_:
        if ((local_e9 & 1) != 0) {
          process_empty_brackets::anon_class_16_2_da9a1ae8::operator()(in_stack_fffffffffffffd10);
        }
        local_15c = 3;
        std::deque<int,_std::allocator<int>_>::push_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                   (value_type_conflict5 *)in_stack_fffffffffffffca8);
        local_e9 = 1;
        break;
      case lrb_:
        bVar1 = std::deque<int,_std::allocator<int>_>::empty
                          ((deque<int,_std::allocator<int>_> *)0x21d52a);
        if (bVar1) {
          local_232 = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"Parentheses do not match.",&local_231);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_232 = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        pvVar5 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffcc0);
        if (*pvVar5 != 3) {
          local_25a = 1;
          uVar4 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_258,"The parentheses type does not match.(Request Large Bracket)",
                     &local_259);
          compile_error::compile_error
                    (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
          local_25a = 0;
          __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
        }
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0);
        if ((local_e9 & 1) == 0) goto switchD_0021ced6_default;
        local_e9 = 0;
        in_stack_fffffffffffffcc0 = local_10;
        pvVar6 = token_base::operator_new((size_t)in_stack_fffffffffffffcb0);
        token_signal::token_signal
                  (in_stack_fffffffffffffd00,
                   (signal_types)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        local_268 = pvVar6;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
        break;
      default:
        goto switchD_0021ced6_default;
      }
    }
    else {
switchD_0021ced6_default:
      if (((local_e9 & 1) != 0) &&
         (bVar1 = std::deque<int,_std::allocator<int>_>::empty
                            ((deque<int,_std::allocator<int>_> *)0x21d7ac), !bVar1)) {
        local_e9 = 0;
        process_empty_brackets::anon_class_16_2_da9a1ae8::operator()(in_stack_fffffffffffffd10);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
    }
    std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
              ((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *)
               in_stack_fffffffffffffcb0);
  } while( true );
}

Assistant:

void compiler_type::process_empty_brackets(std::deque<token_base *> &tokens)
	{
		if (tokens.empty())
			throw compile_error("Received empty token buffer.");
		std::deque<token_base *> oldt;
		std::swap(tokens, oldt);
		tokens.clear();
		std::deque<int> blist_stack;
		bool empty_bracket = false;
		auto insert_bracket = [&]() {
			switch (blist_stack.front()) {
			case 1:
				tokens.push_back(new token_signal(signal_types::slb_));
				break;
			case 2:
				tokens.push_back(new token_signal(signal_types::mlb_));
				break;
			case 3:
				tokens.push_back(new token_signal(signal_types::llb_));
				break;
			}
		};
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal) {
				switch (static_cast<token_signal *>(ptr)->get_signal()) {
				default:
					break;
				case signal_types::slb_:
					if (empty_bracket)
						insert_bracket();
					blist_stack.push_front(1);
					empty_bracket = true;
					continue;
				case signal_types::mlb_:
					if (empty_bracket)
						insert_bracket();
					blist_stack.push_front(2);
					empty_bracket = true;
					continue;
				case signal_types::llb_:
					if (empty_bracket)
						insert_bracket();
					blist_stack.push_front(3);
					empty_bracket = true;
					continue;
				case signal_types::srb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 1)
						throw compile_error("The parentheses type does not match.(Request Small Bracket)");
					blist_stack.pop_front();
					if (empty_bracket) {
						empty_bracket = false;
						tokens.push_back(new token_signal(signal_types::esb_));
						continue;
					}
					break;
				case signal_types::mrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 2)
						throw compile_error("The parentheses type does not match.(Request Middle Bracket)");
					blist_stack.pop_front();
					if (empty_bracket) {
						empty_bracket = false;
						tokens.push_back(new token_signal(signal_types::emb_));
						continue;
					}
					break;
				case signal_types::lrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 3)
						throw compile_error("The parentheses type does not match.(Request Large Bracket)");
					blist_stack.pop_front();
					if (empty_bracket) {
						empty_bracket = false;
						tokens.push_back(new token_signal(signal_types::elb_));
						continue;
					}
					break;
				}
			}
			if (empty_bracket && !blist_stack.empty()) {
				empty_bracket = false;
				insert_bracket();
			}
			tokens.push_back(ptr);
		}
		if (!blist_stack.empty())
			throw compile_error("Parentheses do not match.");
	}